

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_non_empty_dir(void)

{
  void *dir;
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  
  cleanup_test_files();
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_mkdir(puVar2,&mkdir_req,"test_dir",0x1ed,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_open(puVar2,&create_req,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) {
      pcVar4 = "r >= 0";
      uVar3 = 0x16c;
    }
    else {
      uv_fs_req_cleanup(&create_req);
      puVar2 = uv_default_loop();
      iVar1 = uv_fs_close(puVar2,&close_req,(uv_file)create_req.result,(uv_fs_cb)0x0);
      if (iVar1 == 0) {
        uv_fs_req_cleanup(&close_req);
        puVar2 = uv_default_loop();
        iVar1 = uv_fs_open(puVar2,&create_req,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
        if (iVar1 < 0) {
          pcVar4 = "r >= 0";
          uVar3 = 0x17a;
        }
        else {
          uv_fs_req_cleanup(&create_req);
          puVar2 = uv_default_loop();
          iVar1 = uv_fs_close(puVar2,&close_req,(uv_file)create_req.result,(uv_fs_cb)0x0);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&close_req);
            puVar2 = uv_default_loop();
            iVar1 = uv_fs_mkdir(puVar2,&mkdir_req,"test_dir/test_subdir",0x1ed,(uv_fs_cb)0x0);
            if (iVar1 == 0) {
              uv_fs_req_cleanup(&mkdir_req);
              memset(&opendir_req,0xdb,0x1b8);
              puVar2 = uv_default_loop();
              iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
              dir = opendir_req.ptr;
              if (iVar1 == 0) {
                if (opendir_req.fs_type == UV_FS_OPENDIR) {
                  if (opendir_req.result == 0) {
                    if (opendir_req.ptr == (void *)0x0) {
                      pcVar4 = "opendir_req.ptr != NULL";
                      uVar3 = 0x193;
                    }
                    else {
                      *(uv_dirent_t **)opendir_req.ptr = dirents;
                      *(undefined8 *)((long)dir + 8) = 1;
                      uv_fs_req_cleanup(&opendir_req);
                      lVar5 = 3;
                      while( true ) {
                        puVar2 = uv_default_loop();
                        iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)dir,(uv_fs_cb)0x0);
                        pcVar4 = dirents[0].name;
                        if (iVar1 == 0) break;
                        iVar1 = strcmp(dirents[0].name,"file1");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(pcVar4,"file2");
                          if (iVar1 != 0) {
                            iVar1 = strcmp(pcVar4,"test_subdir");
                            if (iVar1 != 0) {
                              pcVar4 = 
                              "strcmp(dirents[0].name, \"file1\") == 0 || strcmp(dirents[0].name, \"file2\") == 0 || strcmp(dirents[0].name, \"test_subdir\") == 0"
                              ;
                              uVar3 = 0x1a1;
                              goto LAB_0012b1dd;
                            }
                          }
                        }
                        iVar1 = strcmp(pcVar4,"test_subdir");
                        if (iVar1 == 0) {
                          if (dirents[0].type != UV_DIRENT_DIR) {
                            pcVar4 = "dirents[0].type == UV_DIRENT_DIR";
                            uVar3 = 0x1a4;
                            goto LAB_0012b1dd;
                          }
                        }
                        else if (dirents[0].type != UV_DIRENT_FILE) {
                          pcVar4 = "dirents[0].type == UV_DIRENT_FILE";
                          uVar3 = 0x1a6;
                          goto LAB_0012b1dd;
                        }
                        uv_fs_req_cleanup(&readdir_req);
                        lVar5 = lVar5 + -1;
                      }
                      if (lVar5 == 0) {
                        uv_fs_req_cleanup(&readdir_req);
                        memset(&closedir_req,0xdb,0x1b8);
                        puVar2 = uv_default_loop();
                        uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)dir,(uv_fs_cb)0x0);
                        if (closedir_req.result == 0) {
                          uv_fs_req_cleanup(&closedir_req);
                          memset(&opendir_req,0xdb,0x1b8);
                          puVar2 = uv_default_loop();
                          iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb)
                          ;
                          if (iVar1 == 0) {
                            if (non_empty_opendir_cb_count == 0) {
                              if (non_empty_closedir_cb_count == 0) {
                                puVar2 = uv_default_loop();
                                iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                                if (iVar1 == 0) {
                                  if (non_empty_opendir_cb_count == 1) {
                                    if (non_empty_closedir_cb_count == 1) {
                                      puVar2 = uv_default_loop();
                                      uv_fs_rmdir(puVar2,&rmdir_req,"test_subdir",(uv_fs_cb)0x0);
                                      uv_fs_req_cleanup(&rmdir_req);
                                      cleanup_test_files();
                                      puVar2 = uv_default_loop();
                                      close_loop(puVar2);
                                      puVar2 = uv_default_loop();
                                      iVar1 = uv_loop_close(puVar2);
                                      if (iVar1 == 0) {
                                        return 0;
                                      }
                                      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                      uVar3 = 0x1cc;
                                    }
                                    else {
                                      pcVar4 = "non_empty_closedir_cb_count == 1";
                                      uVar3 = 0x1c6;
                                    }
                                  }
                                  else {
                                    pcVar4 = "non_empty_opendir_cb_count == 1";
                                    uVar3 = 0x1c5;
                                  }
                                }
                                else {
                                  pcVar4 = "r == 0";
                                  uVar3 = 0x1c4;
                                }
                              }
                              else {
                                pcVar4 = "non_empty_closedir_cb_count == 0";
                                uVar3 = 0x1c2;
                              }
                            }
                            else {
                              pcVar4 = "non_empty_opendir_cb_count == 0";
                              uVar3 = 0x1c1;
                            }
                          }
                          else {
                            pcVar4 = "r == 0";
                            uVar3 = 0x1c0;
                          }
                        }
                        else {
                          pcVar4 = "closedir_req.result == 0";
                          uVar3 = 0x1b4;
                        }
                      }
                      else {
                        pcVar4 = "entries_count == 3";
                        uVar3 = 0x1ae;
                      }
                    }
                  }
                  else {
                    pcVar4 = "opendir_req.result == 0";
                    uVar3 = 0x192;
                  }
                }
                else {
                  pcVar4 = "opendir_req.fs_type == UV_FS_OPENDIR";
                  uVar3 = 0x191;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 400;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x188;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x180;
          }
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x172;
      }
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x164;
  }
LAB_0012b1dd:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT(r == 0);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT(entries_count == 3);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 0);
  ASSERT(non_empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 1);
  ASSERT(non_empty_closedir_cb_count == 1);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY();
  return 0;
 }